

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model-base-ekf-flex-estimator-imu.cpp
# Opt level: O1

void __thiscall
stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::
updateMeasurementCovarianceMatrix_(ModelBaseEKFFlexEstimatorIMU *this)

{
  double dVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar4;
  ulong uVar5;
  Index col;
  long lVar6;
  uint uVar7;
  double *pdVar8;
  Index inner;
  long lVar9;
  long lVar10;
  Matrix *_this;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  double dVar14;
  SrcEvaluatorType srcEvaluator;
  DstEvaluatorType dstEvaluator;
  int local_e0;
  assign_op<double,_double> local_d1;
  ulong local_d0;
  ulong local_c8;
  Matrix *local_c0;
  long local_b8;
  SrcEvaluatorType local_b0;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_a0;
  DstXprType local_80;
  DstEvaluatorType local_48;
  
  _this = &this->R_;
  lVar10 = (this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows;
  iVar2 = (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
            _vptr_FlexibilityEstimatorBase[0x14])();
  if (lVar10 != CONCAT44(extraout_var,iVar2)) {
    lVar10 = (this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_rows;
    iVar2 = (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
              _vptr_FlexibilityEstimatorBase[0x14])(this);
    iVar3 = (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
              _vptr_FlexibilityEstimatorBase[0x14])(this);
    Eigen::internal::
    conservative_resize_like_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false>
    ::run((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)_this,
          CONCAT44(extraout_var_00,iVar2),CONCAT44(extraout_var_01,iVar3));
    uVar12 = 6;
    local_c0 = _this;
    local_b8 = lVar10;
    if (this->useFTSensors_ == true) {
      uVar7 = (this->functor_).nbContacts_ * 6;
      uVar13 = (ulong)uVar7;
      if (lVar10 < (long)(uVar13 + 6)) {
        lVar10 = (this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows;
        if (((long)(lVar10 - uVar13) < 6) ||
           ((this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_cols < 6)) goto LAB_0014f788;
        pdVar8 = (this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data + 6;
        if (((ulong)pdVar8 & 7) == 0) {
          uVar11 = (ulong)((uint)((ulong)pdVar8 >> 3) & 1);
          if (uVar13 <= uVar11) {
            uVar11 = uVar13;
          }
          local_c8 = lVar10 * 8;
          lVar6 = 6;
          local_d0 = uVar13;
          do {
            if (0 < (long)uVar11) {
              *pdVar8 = 0.0;
            }
            uVar13 = local_d0 - uVar11 & 0xfffffffffffffffe;
            lVar9 = uVar13 + uVar11;
            if (0 < (long)uVar13) {
              lVar4 = uVar11 + 2;
              if ((long)(uVar11 + 2) < lVar9) {
                lVar4 = lVar9;
              }
              memset(pdVar8 + uVar11,0,(~uVar11 + lVar4 & 0xfffffffffffffffe) * 8 + 0x10);
            }
            if (local_d0 - lVar9 != 0 && lVar9 <= (long)local_d0) {
              memset(pdVar8 + uVar13 + uVar11,0,(local_d0 - lVar9) * 8);
            }
            local_e0 = (int)lVar10;
            uVar11 = (ulong)((int)uVar11 + local_e0 & 1);
            if ((long)local_d0 < (long)uVar11) {
              uVar11 = local_d0;
            }
            pdVar8 = (double *)((long)pdVar8 + local_c8);
            lVar6 = lVar6 + -1;
            _this = local_c0;
          } while (lVar6 != 0);
        }
        else {
          lVar6 = 6;
          do {
            if (uVar7 != 0) {
              memset(pdVar8,0,uVar13 << 3);
            }
            pdVar8 = pdVar8 + lVar10;
            lVar6 = lVar6 + -1;
          } while (lVar6 != 0);
        }
        lVar10 = (this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows;
        if (lVar10 < 6) goto LAB_0014f788;
        uVar7 = (this->functor_).nbContacts_ * 6;
        uVar13 = (ulong)uVar7;
        if ((long)((this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_cols - uVar13) < 6) goto LAB_0014f788;
        pdVar8 = (this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data + lVar10 * 6;
        if (((ulong)pdVar8 & 7) == 0) {
          if (uVar7 != 0) {
            uVar11 = (ulong)pdVar8 >> 3;
            do {
              if ((uVar11 & 1) != 0) {
                *pdVar8 = 0.0;
              }
              uVar7 = (uint)uVar11 & 1;
              uVar11 = (ulong)uVar7;
              uVar5 = (ulong)(6 - uVar7 & 0xfffffffe | uVar7);
              if (uVar5 <= uVar11 + 2) {
                uVar5 = uVar11 + 2;
              }
              memset(pdVar8 + uVar11,0,((~uVar11 + uVar5) * 8 & 0x7ffffffffffffff0) + 0x10);
              if (uVar11 != 0) {
                pdVar8[5] = 0.0;
              }
              uVar11 = uVar11 + lVar10;
              pdVar8 = pdVar8 + lVar10;
              uVar13 = uVar13 - 1;
            } while (uVar13 != 0);
          }
        }
        else if (uVar7 != 0) {
          do {
            pdVar8[4] = 0.0;
            pdVar8[5] = 0.0;
            pdVar8[2] = 0.0;
            pdVar8[3] = 0.0;
            *pdVar8 = 0.0;
            pdVar8[1] = 0.0;
            pdVar8 = pdVar8 + lVar10;
            uVar13 = uVar13 - 1;
          } while (uVar13 != 0);
        }
        if ((this->functor_).nbContacts_ != 0) {
          lVar10 = 0x30;
          uVar13 = 0;
          uVar12 = 6;
          do {
            local_80.
            super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
            m_outerStride =
                 (this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows;
            local_80.
            super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
            m_data = (PointerType)
                     ((long)(this->R_).
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_data +
                     local_80.
                     super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                     .
                     super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                     .m_outerStride * uVar12 * 8 + lVar10);
            local_80.
            super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
            m_rows.m_value = 6;
            local_80.
            super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
            m_cols.m_value = 6;
            local_80.
            super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
            m_xpr = _this;
            local_80.
            super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
            m_startRow.m_value = uVar12;
            local_80.
            super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
            m_startCol.m_value = uVar12;
            if ((local_80.
                 super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                 .m_outerStride + -6 < (long)uVar12) ||
               ((this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_cols + -6 < (long)uVar12)) goto LAB_0014f788;
            local_b0.
            super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_d.
            data = (this->forceVariance_).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
            ;
            local_b0.
            super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_d.
            m_outerStride =
                 (this->forceVariance_).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
            if ((local_b0.
                 super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                 .m_d.m_outerStride != 6) ||
               ((this->forceVariance_).
                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols !=
                6)) {
              __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                            ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                            "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1>>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>>]"
                           );
            }
            local_a0.m_dst = &local_48;
            local_a0.m_src = &local_b0;
            local_a0.m_functor = &local_d1;
            local_a0.m_dstExpr = &local_80;
            local_48.
            super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
            super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
            .m_data = local_80.
                      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                      .
                      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                      .
                      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                      .m_data;
            local_48.
            super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
            super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
            .m_outerStride.m_value =
                 local_80.
                 super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                 .m_outerStride;
            Eigen::internal::
            dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
            ::run(&local_a0);
            uVar12 = uVar12 + 6;
            uVar13 = uVar13 + 1;
            lVar10 = lVar10 + 0x30;
          } while (uVar13 < (this->functor_).nbContacts_);
        }
      }
    }
    if ((local_b8 < (long)(uVar12 + 6) & this->withAbsolutePos_) == 1) {
      lVar10 = (this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
               .m_rows;
      if (((long)uVar12 <= lVar10 + -6) &&
         ((long)uVar12 <=
          (this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols)) {
        pdVar8 = (this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data + uVar12;
        uVar13 = uVar12;
        if (((ulong)pdVar8 & 7) == 0) {
          uVar11 = (ulong)pdVar8 >> 3;
          do {
            if ((uVar11 & 1) != 0) {
              *pdVar8 = 0.0;
            }
            uVar7 = (uint)uVar11 & 1;
            uVar11 = (ulong)uVar7;
            uVar5 = (ulong)(6 - uVar7 & 0xfffffffe | uVar7);
            if (uVar5 <= uVar11 + 2) {
              uVar5 = uVar11 + 2;
            }
            memset(pdVar8 + uVar11,0,((~uVar11 + uVar5) * 8 & 0x7ffffffffffffff0) + 0x10);
            if (uVar11 != 0) {
              pdVar8[5] = 0.0;
            }
            uVar11 = uVar11 + lVar10;
            pdVar8 = pdVar8 + lVar10;
            uVar13 = uVar13 - 1;
          } while (uVar13 != 0);
        }
        else {
          do {
            pdVar8[4] = 0.0;
            pdVar8[5] = 0.0;
            pdVar8[2] = 0.0;
            pdVar8[3] = 0.0;
            *pdVar8 = 0.0;
            pdVar8[1] = 0.0;
            pdVar8 = pdVar8 + lVar10;
            uVar13 = uVar13 - 1;
          } while (uVar13 != 0);
        }
        lVar10 = (this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows;
        if (((long)uVar12 <= lVar10) &&
           ((long)uVar12 <=
            (this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_cols + -6)) {
          pdVar8 = (this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_data + lVar10 * uVar12;
          if (((ulong)pdVar8 & 7) == 0) {
            local_c8 = (ulong)((uint)lVar10 & 1);
            uVar13 = (ulong)((uint)((ulong)pdVar8 >> 3) & 1);
            if ((long)uVar12 <= (long)uVar13) {
              uVar13 = uVar12;
            }
            local_d0 = lVar10 << 3;
            lVar10 = 6;
            do {
              if (0 < (long)uVar13) {
                *pdVar8 = 0.0;
              }
              uVar11 = uVar12 - uVar13 & 0xfffffffffffffffe;
              lVar6 = uVar13 + uVar11;
              if (0 < (long)uVar11) {
                lVar9 = uVar13 + 2;
                if ((long)(uVar13 + 2) < lVar6) {
                  lVar9 = lVar6;
                }
                memset(pdVar8 + uVar13,0,(~uVar13 + lVar9 & 0xfffffffffffffffe) * 8 + 0x10);
              }
              if (uVar12 - lVar6 != 0 && lVar6 <= (long)uVar12) {
                memset(pdVar8 + uVar11 + uVar13,0,(uVar12 - lVar6) * 8);
              }
              uVar13 = (long)(uVar13 + local_c8) % 2;
              if ((long)uVar12 < (long)uVar13) {
                uVar13 = uVar12;
              }
              pdVar8 = (double *)((long)pdVar8 + local_d0);
              lVar10 = lVar10 + -1;
            } while (lVar10 != 0);
          }
          else {
            lVar6 = 6;
            do {
              memset(pdVar8,0,uVar12 * 8);
              pdVar8 = pdVar8 + lVar10;
              lVar6 = lVar6 + -1;
            } while (lVar6 != 0);
          }
          lVar10 = (this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_rows;
          if (((long)uVar12 <= lVar10 + -6) &&
             ((long)uVar12 <=
              (this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols + -6)) {
            dVar1 = this->absPosVariance_;
            pdVar8 = (this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_data + uVar12 + uVar12 * lVar10;
            lVar6 = 0;
            do {
              lVar9 = 0;
              do {
                dVar14 = 1.0;
                if (lVar6 != lVar9) {
                  dVar14 = 0.0;
                }
                pdVar8[lVar9] = dVar14 * dVar1;
                lVar9 = lVar9 + 1;
              } while (lVar9 != 6);
              lVar6 = lVar6 + 1;
              pdVar8 = pdVar8 + lVar10;
              _this = local_c0;
            } while (lVar6 != 6);
            goto LAB_0014f76a;
          }
        }
      }
LAB_0014f788:
      __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                    ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                    "Eigen::Block<Eigen::Matrix<double, -1, -1>>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
                   );
    }
  }
LAB_0014f76a:
  KalmanFilterBase::setR
            (&(this->super_EKFFlexibilityEstimatorBase).ekf_.super_KalmanFilterBase,_this);
  return;
}

Assistant:

void ModelBaseEKFFlexEstimatorIMU::updateMeasurementCovarianceMatrix_()
{

  if(R_.rows() != getMeasurementSize())
  {

    Index realIndex = R_.rows();
    R_.conservativeResize(getMeasurementSize(), getMeasurementSize());

    Index currIndex = 6;
    if(useFTSensors_)
    {
      /// if the force part of the matrix is not filled
      if(realIndex < currIndex + functor_.getContactsNumber() * 6)
      {
        R_.block(currIndex, 0, functor_.getContactsNumber() * 6, currIndex).setZero();
        R_.block(0, currIndex, currIndex, functor_.getContactsNumber() * 6).setZero();
        for(Index i = 0; i < functor_.getContactsNumber(); ++i)
        {
          R_.block(currIndex, currIndex, 6, 6) = forceVariance_;
          currIndex += 6;
        }
      }
    }

    if(withAbsolutePos_)
    {
      if(realIndex < currIndex + 6)
      {

        R_.block(currIndex, 0, 6, currIndex).setZero();
        R_.block(0, currIndex, currIndex, 6).setZero();
        R_.block(currIndex, currIndex, 6, 6) = Matrix::Identity(6, 6) * absPosVariance_;

        currIndex += 6;
      }
    }
  }
  ekf_.setR(R_);
}